

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O2

void __thiscall
dg::pta::PointerAnalysisFI::PointerAnalysisFI
          (PointerAnalysisFI *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  size_t sVar1;
  size_type __n;
  PointerAnalysisOptions local_60;
  
  PointerAnalysisOptions::PointerAnalysisOptions(&local_60,opts);
  PointerAnalysis::PointerAnalysis(&this->super_PointerAnalysis,ps,&local_60);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::~_Rb_tree(&local_60.super_AnalysisOptions.allocationFunctions._M_t);
  (this->super_PointerAnalysis)._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFI_001409b8;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = PointerGraph::size(ps);
  __n = 8;
  if (8 < sVar1 / 100) {
    __n = sVar1 / 100;
  }
  std::
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ::reserve(&this->memory_objects,__n);
  return;
}

Assistant:

PointerAnalysisFI(PointerGraph *ps, const PointerAnalysisOptions &opts)
            : PointerAnalysis(ps, opts) {
        memory_objects.reserve(
                std::max(ps->size() / 100, static_cast<size_t>(8)));
    }